

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void baryonyx::itm::
     init_with_bastert<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::maximize_tag>
               (bit_array *x,quadratic_cost_type<float> *c,int variables,int value_if_0)

{
  bool bVar1;
  float cost;
  undefined4 local_24;
  int i;
  int value_if_0_local;
  int variables_local;
  quadratic_cost_type<float> *c_local;
  bit_array *x_local;
  
  for (local_24 = 0; local_24 != variables; local_24 = local_24 + 1) {
    cost = quadratic_cost_type<float>::operator[](c,local_24);
    bVar1 = init_x<baryonyx::itm::maximize_tag,float>(cost,value_if_0);
    if (bVar1) {
      bit_array_impl::set(&x->super_bit_array_impl,local_24);
    }
    else {
      bit_array_impl::unset(&x->super_bit_array_impl,local_24);
    }
  }
  return;
}

Assistant:

void
init_with_bastert(bit_array& x,
                  const Cost& c,
                  const int variables,
                  const int value_if_0) noexcept
{
    for (int i = 0; i != variables; ++i)
        if (init_x<Mode>(c[i], value_if_0))
            x.set(i);
        else
            x.unset(i);
}